

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-parse.h
# Opt level: O1

pair<unsigned_long,_const_char_*> parseunsigned<char_const*>(char *first,char *last,int base)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  pair<unsigned_long,_const_char_*> pVar10;
  
  uVar3 = 0;
  iVar7 = 0;
  iVar6 = 0;
  pcVar4 = first;
  do {
    if (last <= pcVar4) break;
    cVar1 = *pcVar4;
    iVar5 = (int)cVar1;
    uVar9 = 0xffffffff;
    if (0x2f < iVar5) {
      if (cVar1 < ':') {
        uVar9 = (ulong)(iVar5 - 0x30);
      }
      else if ('@' < cVar1) {
        if (cVar1 < '[') {
          uVar9 = (ulong)(iVar5 - 0x37);
        }
        else {
          uVar9 = (ulong)(iVar5 - 0x57);
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            uVar9 = 0xffffffff;
          }
        }
      }
    }
    uVar8 = (uint)uVar9;
    if (base == 0) {
      if (iVar7 == 1) {
        iVar7 = 3;
        if (cVar1 == 'x') {
          base = 0x10;
        }
        else if (cVar1 == 'b') {
          base = 2;
        }
        else {
          if (uVar8 == 0xffffffff) {
            base = 0;
            iVar7 = 1;
            goto LAB_00109a08;
          }
          if (uVar8 < 8) {
            base = 8;
            iVar6 = 1;
            uVar3 = uVar9;
          }
          else {
            iVar7 = 1;
            base = 0;
            if (7 < (int)uVar8) goto LAB_00109a02;
          }
        }
      }
      else {
        if (iVar7 != 0) {
LAB_00109a02:
          base = 0;
          iVar7 = 2;
          goto LAB_00109a08;
        }
        if (uVar8 - 1 < 9) {
          base = 10;
          iVar6 = 1;
          iVar7 = 3;
          uVar3 = uVar9;
        }
        else {
          base = 0;
          if (uVar8 != 0) goto LAB_00109a02;
          iVar7 = 1;
        }
      }
LAB_001099ad:
      pcVar4 = pcVar4 + 1;
      bVar2 = true;
    }
    else {
      if ((int)uVar8 < base && -1 < (int)uVar8) {
        iVar6 = iVar6 + 1;
        uVar3 = uVar3 * (uint)base + uVar9;
        goto LAB_001099ad;
      }
LAB_00109a08:
      bVar2 = false;
    }
  } while (bVar2);
  if (iVar7 == 2) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    if (iVar7 != 3 || iVar6 != 0) {
      uVar9 = uVar3;
      first = pcVar4;
    }
  }
  pVar10.second = first;
  pVar10.first = uVar9;
  return pVar10;
}

Assistant:

std::pair<uint64_t, P> parseunsigned(P first, P last, int base)
{
    int state = 0;    // 3 = foundbase, 2 = invalid, 1 = found '0', 0 = initial state.
    int digits = 0;
    uint64_t num = 0;
    auto p = first;
    while (p<last)
    {
        int n = char2nyble(*p);
        if (base==0) {
            if (state==0) {
                if (1<=n && n<=9) {
                    base = 10;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n==0) {
                    // expect 0<octal>, 0b<binary>, 0x<hex>
                    state = 1;
                }
                else {
                    // invalid
                    state = 2;
                    break;
                }
            }
            else if (state==1) {
                if (*p == 'x') {
                    base = 16;
                    state = 3;
                }
                else if (*p == 'b') {
                    base = 2;
                    state = 3;
                }
                else if (n==-1) {
                    // just a single '0' followed by a non digit
                    // -> return '0'
                    break;
                }
                else if (0<=n && n<=7) {
                    base = 8;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n>=8) {
                    // invalid octal digit
                    state = 2;
                    break;
                }
            }
            else {
                // invalid
                state = 2;
                break;
            }
        }
        else {
            if (n<0 || n>=base) {
                // end of number
                break;
            }
            num *= base;
            num += n;
            digits++;
        }

        ++p;
    }
    if (state==2)  // invalid
        return std::make_pair(0, first);

    if (state==3 && digits==0) {
        // "0x" and "0b" are invalid numbers, they expect digits.
        return std::make_pair(0, first);
    }
    return std::make_pair(num, p);
}